

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

MeanVarianceNormalizeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_mvn(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0xa5) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xa5;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    MeanVarianceNormalizeLayerParams::MeanVarianceNormalizeLayerParams(this_00.mvn_);
    (this->layer_).mvn_ = (MeanVarianceNormalizeLayerParams *)this_00;
  }
  return (MeanVarianceNormalizeLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::MeanVarianceNormalizeLayerParams* NeuralNetworkLayer::mutable_mvn() {
  if (!has_mvn()) {
    clear_layer();
    set_has_mvn();
    layer_.mvn_ = new ::CoreML::Specification::MeanVarianceNormalizeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.mvn)
  return layer_.mvn_;
}